

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizard::next(QWizard *this)

{
  long lVar1;
  uint *puVar2;
  QWizardPrivate *this_00;
  long lVar3;
  char cVar4;
  bool bVar5;
  long lVar6;
  long in_FS_OFFSET;
  int next;
  char local_40 [24];
  char *local_28;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  if (this_00->current != -1) {
    cVar4 = (**(code **)(*(long *)&(this->super_QDialog).super_QWidget + 0x1c8))();
    if (cVar4 != '\0') {
      local_1c = (**(code **)(*(long *)&(this->super_QDialog).super_QWidget + 0x1d0))(this);
      if (local_1c != 0xffffffff) {
        lVar3 = (this_00->history).d.size;
        if (lVar3 != 0) {
          lVar6 = 0;
          do {
            if (lVar3 << 2 == lVar6) goto LAB_0050e606;
            lVar1 = lVar6 + 4;
            puVar2 = (uint *)((long)(this_00->history).d.ptr + lVar6);
            lVar6 = lVar1;
          } while (*puVar2 != local_1c);
          if (lVar1 != 0) {
            local_40[0] = '\x02';
            local_40[1] = '\0';
            local_40[2] = '\0';
            local_40[3] = '\0';
            local_40[4] = '\0';
            local_40[5] = '\0';
            local_40[6] = '\0';
            local_40[7] = '\0';
            local_40[8] = '\0';
            local_40[9] = '\0';
            local_40[10] = '\0';
            local_40[0xb] = '\0';
            local_40[0xc] = '\0';
            local_40[0xd] = '\0';
            local_40[0xe] = '\0';
            local_40[0xf] = '\0';
            local_40[0x10] = '\0';
            local_40[0x11] = '\0';
            local_40[0x12] = '\0';
            local_40[0x13] = '\0';
            local_40[0x14] = '\0';
            local_40[0x15] = '\0';
            local_40[0x16] = '\0';
            local_40[0x17] = '\0';
            local_28 = "default";
            QMessageLogger::warning(local_40,"QWizard::next: Page %d already met",(ulong)local_1c);
            goto LAB_0050e62c;
          }
        }
LAB_0050e606:
        bVar5 = QMap<int,_QWizardPage_*>::contains
                          (&this_00->pageMap,(int *)&stack0xffffffffffffffe4);
        if (bVar5) {
          QWizardPrivate::switchToPage(this_00,local_1c,Forward);
        }
        else {
          QWizard::next((QWizard *)&stack0xffffffffffffffe4);
        }
      }
    }
  }
LAB_0050e62c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::next()
{
    Q_D(QWizard);

    if (d->current == -1)
        return;

    if (validateCurrentPage()) {
        int next = nextId();
        if (next != -1) {
            if (Q_UNLIKELY(d->history.contains(next))) {
                qWarning("QWizard::next: Page %d already met", next);
                return;
            }
            if (Q_UNLIKELY(!d->pageMap.contains(next))) {
                qWarning("QWizard::next: No such page %d", next);
                return;
            }
            d->switchToPage(next, QWizardPrivate::Forward);
        }
    }
}